

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_manager.cpp
# Opt level: O1

void __thiscall CfdCoreManager_Initialize_Test::TestBody(CfdCoreManager_Initialize_Test *this)

{
  bool bVar1;
  CfdCoreHandle handle;
  CfdCoreManagerFinalizedTest finalize_test;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  CfdCoreHandle local_60;
  CfdCoreManager local_58;
  
  cfd::core::CfdCoreManager::CfdCoreManager(&local_58);
  local_58._vptr_CfdCoreManager = (_func_int **)&PTR__CfdCoreManager_006a5d18;
  local_58.finalized_ = true;
  local_60 = (CfdCoreHandle)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::CfdCoreManager::Initialize(&local_58,&local_60);
  }
  testing::Message::Message((Message *)&local_70);
  testing::internal::AssertHelper::AssertHelper
            (&local_68,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_manager.cpp"
             ,0x3b,
             "Expected: (finalize_test.Initialize(&handle)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  if (local_70.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_70.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_70.ptr_ + 8))();
    }
    local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  cfd::core::CfdCoreManager::~CfdCoreManager(&local_58);
  return;
}

Assistant:

TEST(CfdCoreManager, Initialize) {
  CfdCoreManagerFinalizedTest finalize_test;
  CfdCoreHandle handle = nullptr;
  EXPECT_THROW((finalize_test.Initialize(&handle)), CfdException);
}